

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O2

QString * __thiscall
QDirPrivate::resolveAbsoluteEntry(QString *__return_storage_ptr__,QDirPrivate *this)

{
  QFileSystemEntry *this_00;
  QAbstractFileEngine *pQVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  bool bVar5;
  QFileSystemEntry *this_01;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_b8;
  QArrayDataPointer<char16_t> local_98;
  QFileSystemEntry absoluteFileSystemEntry;
  undefined1 local_40 [16];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_40._0_8_ = &this->fileCache;
  local_40._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QBasicMutex::lock((QBasicMutex *)local_40._0_8_);
  local_40[8] = true;
  this_00 = &(this->fileCache).absoluteDirEntry;
  bVar5 = QFileSystemEntry::isEmpty(this_00);
  this_01 = this_00;
  if (bVar5) {
    this_01 = &this->dirEntry;
    bVar5 = QFileSystemEntry::isEmpty(this_01);
    if (!bVar5) {
      local_98.size = 0;
      local_98.d = (Data *)0x0;
      local_98.ptr = (char16_t *)0x0;
      pQVar1 = (this->fileEngine)._M_t.
               super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
               ._M_t.
               super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
               .super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl;
      if (pQVar1 == (QAbstractFileEngine *)0x0) {
        bVar5 = QFileSystemEntry::isRelative(this_01);
        if ((bVar5) || (bVar5 = QFileSystemEntry::isClean(this_01), !bVar5)) {
          QFileSystemEngine::absoluteName(&absoluteFileSystemEntry,this_01);
          QFileSystemEntry::filePath((QString *)&local_b8,&absoluteFileSystemEntry);
          qVar4 = local_98.size;
          pcVar3 = local_98.ptr;
          pDVar2 = local_98.d;
          local_98.d = local_b8.d;
          local_98.ptr = local_b8.ptr;
          local_b8.d = pDVar2;
          local_b8.ptr = pcVar3;
          local_98.size = local_b8.size;
          local_b8.size = qVar4;
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
          QFileSystemEntry::~QFileSystemEntry(&absoluteFileSystemEntry);
          goto LAB_0021582c;
        }
        QFileSystemEntry::operator=(this_00,this_01);
        QFileSystemEntry::filePath(__return_storage_ptr__,this_01);
      }
      else {
        (*pQVar1->_vptr_QAbstractFileEngine[0x19])(&absoluteFileSystemEntry,pQVar1,3);
        qVar4 = local_98.size;
        pcVar3 = local_98.ptr;
        pDVar2 = local_98.d;
        local_98.d = absoluteFileSystemEntry.m_filePath.d.d;
        local_98.ptr = absoluteFileSystemEntry.m_filePath.d.ptr;
        absoluteFileSystemEntry.m_filePath.d.d = pDVar2;
        absoluteFileSystemEntry.m_filePath.d.ptr = pcVar3;
        local_98.size = absoluteFileSystemEntry.m_filePath.d.size;
        absoluteFileSystemEntry.m_filePath.d.size = qVar4;
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)&absoluteFileSystemEntry);
LAB_0021582c:
        absoluteFileSystemEntry._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
        absoluteFileSystemEntry.m_nativeFilePath.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
        absoluteFileSystemEntry.m_nativeFilePath.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        absoluteFileSystemEntry.m_filePath.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        absoluteFileSystemEntry.m_nativeFilePath.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        absoluteFileSystemEntry.m_filePath.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        absoluteFileSystemEntry.m_filePath.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QDir::cleanPath((QString *)&local_b8,(QString *)&local_98);
        QFileSystemEntry::QFileSystemEntry(&absoluteFileSystemEntry,&local_b8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
        QFileSystemEntry::operator=(this_00,&absoluteFileSystemEntry);
        QFileSystemEntry::filePath(__return_storage_ptr__,&absoluteFileSystemEntry);
        QFileSystemEntry::~QFileSystemEntry(&absoluteFileSystemEntry);
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
      goto LAB_00215898;
    }
  }
  QFileSystemEntry::filePath(__return_storage_ptr__,this_01);
LAB_00215898:
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

inline QString QDirPrivate::resolveAbsoluteEntry() const
{
    QMutexLocker locker(&fileCache.mutex);
    if (!fileCache.absoluteDirEntry.isEmpty())
        return fileCache.absoluteDirEntry.filePath();

    if (dirEntry.isEmpty())
        return dirEntry.filePath();

    QString absoluteName;
    if (!fileEngine) {
        if (!dirEntry.isRelative() && dirEntry.isClean()) {
            fileCache.absoluteDirEntry = dirEntry;
            return dirEntry.filePath();
        }

        absoluteName = QFileSystemEngine::absoluteName(dirEntry).filePath();
    } else {
        absoluteName = fileEngine->fileName(QAbstractFileEngine::AbsoluteName);
    }
    auto absoluteFileSystemEntry =
            QFileSystemEntry(QDir::cleanPath(absoluteName), QFileSystemEntry::FromInternalPath());
    fileCache.absoluteDirEntry = absoluteFileSystemEntry;
    return absoluteFileSystemEntry.filePath();
}